

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O3

int add_file(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  ulonglong uVar2;
  longlong lVar3;
  long lVar4;
  
  uVar2 = strtoull(argv[2],(char **)0x0,10);
  lVar3 = strtoll(argv[3],(char **)0x0,10);
  __s1 = argv[1];
  iVar1 = strcmp(__s1,"/dev/stdin");
  if (iVar1 == 0) {
    lVar4 = zip_source_filep(za,_stdin,uVar2,lVar3);
    if (lVar4 == 0) {
      add_file_cold_3();
      return -1;
    }
  }
  else {
    lVar4 = zip_source_file(za,__s1,uVar2,lVar3);
    if (lVar4 == 0) {
      add_file_cold_1();
      return -1;
    }
  }
  lVar4 = zip_add(za,*argv,lVar4);
  if (lVar4 == -1) {
    add_file_cold_2();
    return -1;
  }
  return 0;
}

Assistant:

static int
add_file(int argc, char *argv[]) {
    zip_source_t *zs;
    zip_uint64_t start = strtoull(argv[2], NULL, 10);
    zip_int64_t len = strtoll(argv[3], NULL, 10);

    if (strcmp(argv[1], "/dev/stdin") == 0) {
	if ((zs = zip_source_filep(za, stdin, start, len)) == NULL) {
	    fprintf(stderr, "can't create zip_source from stdin: %s\n", zip_strerror(za));
	    return -1;
	}
    }
    else {
	if ((zs = zip_source_file(za, argv[1], start, len)) == NULL) {
	    fprintf(stderr, "can't create zip_source from file: %s\n", zip_strerror(za));
	    return -1;
	}
    }

    if (zip_add(za, argv[0], zs) == -1) {
	zip_source_free(zs);
	fprintf(stderr, "can't add file '%s': %s\n", argv[0], zip_strerror(za));
	return -1;
    }
    return 0;
}